

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

bool __thiscall lzham::symbol_codec::put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  bool bVar1;
  undefined8 in_RAX;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  undefined8 uStack_28;
  
  if (num_bits == 0) {
    bVar4 = true;
  }
  else {
    iVar3 = this->m_bit_count - num_bits;
    this->m_bit_count = iVar3;
    uVar2 = (ulong)bits << ((byte)iVar3 & 0x3f) | this->m_bit_buf;
    this->m_bit_buf = uVar2;
    this->m_total_bits_written = this->m_total_bits_written + num_bits;
    uStack_28 = in_RAX;
    while (bVar4 = 0x38 < iVar3, iVar3 < 0x39) {
      uStack_28 = CONCAT17((char)(uVar2 >> 0x38),(undefined7)uStack_28);
      bVar1 = vector<unsigned_char>::try_push_back
                        (&this->m_output_buf,(uchar *)((long)&uStack_28 + 7));
      if (!bVar1) {
        return bVar4;
      }
      uVar2 = this->m_bit_buf << 8;
      this->m_bit_buf = uVar2;
      iVar3 = this->m_bit_count + 8;
      this->m_bit_count = iVar3;
    }
  }
  return bVar4;
}

Assistant:

bool symbol_codec::put_bits(uint bits, uint num_bits)
   {
      LZHAM_ASSERT(num_bits <= 25);
      LZHAM_ASSERT(m_bit_count >= 25);

      if (!num_bits)
         return true;

      m_bit_count -= num_bits;
      m_bit_buf |= (static_cast<bit_buf_t>(bits) << m_bit_count);

      m_total_bits_written += num_bits;

      while (m_bit_count <= (cBitBufSize - 8))
      {
         if (!m_output_buf.try_push_back(static_cast<uint8>(m_bit_buf >> (cBitBufSize - 8))))
            return false;

         m_bit_buf <<= 8;
         m_bit_count += 8;
      }

      return true;
   }